

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repository.cpp
# Opt level: O3

void so_5::stats::repository_t::source_list_add(source_t *what,source_t **head,source_t **tail)

{
  if (*tail == (source_t *)0x0) {
    what->m_prev = (source_t *)0x0;
    what->m_next = (source_t *)0x0;
    *head = what;
  }
  else {
    (*tail)->m_next = what;
    what->m_prev = *tail;
    what->m_next = (source_t *)0x0;
  }
  *tail = what;
  return;
}

Assistant:

void
repository_t::source_list_add(
	source_t & what,
	source_t *& head,
	source_t *& tail )
	{
		if( !tail )
			{
				// Addition to the empty list.
				what.m_prev = what.m_next = nullptr;
				head = &what;
			}
		else
			{
				tail->m_next = &what;
				what.m_prev = tail;
				what.m_next = nullptr;
			}

		tail = &what;
	}